

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O2

matrix2f * __thiscall tinyusdz::value::matrix2f::operator=(matrix2f *this,matrix2d *src)

{
  matrix2f *pmVar1;
  size_t j;
  long lVar2;
  long lVar3;
  
  pmVar1 = this;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      (*(float (*) [2])*(float (*) [2])this)[lVar3] =
           (float)(*(double (*) [2])*(double (*) [2])src)[lVar3];
    }
    this = (matrix2f *)((long)this + 8);
    src = (matrix2d *)((long)src + 0x10);
  }
  return pmVar1;
}

Assistant:

matrix2f &matrix2f::operator=(const matrix2d &src) {

  for (size_t j = 0; j < 2; j++) {
    for (size_t i = 0; i < 2; i++) {
      m[j][i] = float(src.m[j][i]);
    }
  }

  return *this;
}